

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O3

kiss_fft_cfg kiss_fft_alloc(int nfft,int inverse_fft,void *mem,size_t *lenmem)

{
  size_t __size;
  kiss_fft_cfg pkVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined8 in_XMM0_Qa;
  double dVar8;
  undefined1 extraout_var [56];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar9 [16];
  
  __size = (long)nfft * 8 + 0x108;
  if (lenmem == (size_t *)0x0) {
    mem = malloc(__size);
  }
  else {
    if (mem == (void *)0x0) {
      mem = (kiss_fft_cfg)0x0;
    }
    else if (*lenmem < __size) {
      mem = (kiss_fft_cfg)0x0;
    }
    *lenmem = __size;
  }
  if ((kiss_fft_cfg)mem != (kiss_fft_cfg)0x0) {
    auVar9._0_8_ = (double)nfft;
    auVar9._8_8_ = in_XMM0_Qa;
    auVar11 = ZEXT1664(auVar9);
    ((kiss_fft_cfg)mem)->nfft = nfft;
    ((kiss_fft_cfg)mem)->inverse = inverse_fft;
    if (0 < nfft) {
      uVar4 = 0;
      do {
        bVar5 = ((kiss_fft_cfg)mem)->inverse == 0;
        auVar10._0_8_ = ((double)(int)uVar4 * -6.283185307179586) / auVar11._0_8_;
        auVar10._8_8_ = 0;
        auVar7._8_8_ = 0x8000000000000000;
        auVar7._0_8_ = 0x8000000000000000;
        auVar7 = vxorpd_avx512vl(auVar10,auVar7);
        dVar6 = (double)((ulong)bVar5 * (long)auVar10._0_8_ + (ulong)!bVar5 * auVar7._0_8_);
        dVar8 = cos(dVar6);
        ((kiss_fft_cfg)mem)->twiddles[uVar4].r = (float)dVar8;
        dVar6 = sin(dVar6);
        auVar11 = ZEXT864((ulong)auVar9._0_8_);
        auVar9._8_8_ = 0;
        ((kiss_fft_cfg)mem)->twiddles[uVar4].i = (float)dVar6;
        uVar4 = uVar4 + 1;
      } while ((uint)nfft != uVar4);
    }
    if (auVar9._0_8_ < 0.0) {
      auVar11._0_8_ = sqrt(auVar9._0_8_);
      auVar11._8_56_ = extraout_var;
      auVar9 = auVar11._0_16_;
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
    }
    auVar9 = vroundsd_avx(auVar9,auVar9,9);
    pkVar1 = (kiss_fft_cfg)mem;
    iVar2 = 4;
    do {
      while (nfft % iVar2 != 0) {
        if (iVar2 == 4) {
          iVar3 = 2;
        }
        else if (iVar2 == 2) {
          iVar3 = 3;
        }
        else {
          iVar3 = iVar2 + 2;
        }
        iVar2 = nfft;
        if ((double)iVar3 <= auVar9._0_8_) {
          iVar2 = iVar3;
        }
      }
      nfft = nfft / iVar2;
      pkVar1->factors[0] = iVar2;
      pkVar1->factors[1] = nfft;
      pkVar1 = (kiss_fft_cfg)pkVar1->factors;
    } while (1 < nfft);
  }
  return (kiss_fft_cfg)mem;
}

Assistant:

kiss_fft_cfg kiss_fft_alloc(int nfft,int inverse_fft,void * mem,size_t * lenmem )
{
    kiss_fft_cfg st=NULL;
    size_t memneeded = sizeof(struct kiss_fft_state)
        + sizeof(kiss_fft_cpx)*(nfft-1); /* twiddle factors*/

    if ( lenmem==NULL ) {
        st = ( kiss_fft_cfg)KISS_FFT_MALLOC( memneeded );
    }else{
        if (mem != NULL && *lenmem >= memneeded)
            st = (kiss_fft_cfg)mem;
        *lenmem = memneeded;
    }
    if (st) {
        int i;
        st->nfft=nfft;
        st->inverse = inverse_fft;

        for (i=0;i<nfft;++i) {
            const double pi=3.141592653589793238462643383279502884197169399375105820974944;
            double phase = -2*pi*i / nfft;
            if (st->inverse)
                phase *= -1;
            kf_cexp(st->twiddles+i, phase );
        }

        kf_factor(nfft,st->factors);
    }
    return st;
}